

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscPrintReceivedElements.cpp
# Opt level: O3

ostream * osc::operator<<(ostream *os,ReceivedMessage *m)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  const_iterator i;
  ReceivedMessageArgument local_30;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"[",1);
  bVar1 = ReceivedMessage::AddressPatternIsUInt32(m);
  if (bVar1) {
    ReceivedMessage::AddressPatternAsUInt32(m);
    std::ostream::_M_insert<unsigned_long>((ulong)os);
  }
  else {
    __s = m->addressPattern_;
    if (__s == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar2 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>(os,__s,sVar2);
    }
  }
  local_30.typeTagPtr_ = m->typeTagsBegin_;
  local_30.argumentPtr_ = m->arguments_;
  if (local_30.typeTagPtr_ != m->typeTagsEnd_) {
    std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
    operator<<(os,&local_30);
    ReceivedMessageArgumentIterator::Advance((ReceivedMessageArgumentIterator *)&local_30);
    if (local_30.typeTagPtr_ != m->typeTagsEnd_) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
        operator<<(os,&local_30);
        ReceivedMessageArgumentIterator::Advance((ReceivedMessageArgumentIterator *)&local_30);
      } while (local_30.typeTagPtr_ != m->typeTagsEnd_);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"]",1);
  return os;
}

Assistant:

std::ostream& operator<<( std::ostream & os, const ReceivedMessage& m )
{
    os << "[";
    if( m.AddressPatternIsUInt32() )
        os << m.AddressPatternAsUInt32();
    else
        os << m.AddressPattern();
    
    bool first = true;
    for( ReceivedMessage::const_iterator i = m.ArgumentsBegin();
            i != m.ArgumentsEnd(); ++i ){
        if( first ){
            os << " ";
            first = false;
        }else{
            os << ", ";
        }

        os << *i;
    }

    os << "]";

    return os;
}